

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O1

void copy_values_for_grow_proc(Am_Object *cmd)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object widget_command;
  Am_Value value;
  Am_Object widget;
  Am_Object local_38;
  Am_Object local_30;
  Am_Value local_28;
  Am_Object local_18;
  
  local_18.data = (Am_Object_Data *)0x0;
  local_38.data = (Am_Object_Data *)0x0;
  Am_Object::Get_Object(&local_30,(Am_Slot_Key)cmd,10);
  Am_Object::Get_Object((Am_Object *)&local_28,(Am_Slot_Key)&local_30,10);
  Am_Object::operator=(&local_18,(Am_Object *)&local_28);
  Am_Object::~Am_Object((Am_Object *)&local_28);
  Am_Object::~Am_Object(&local_30);
  local_28.type = 0;
  local_28.value.wrapper_value = (Am_Wrapper *)0x0;
  bVar1 = Am_Object::Valid(&local_18);
  if (bVar1) {
    Am_Object::Get_Object(&local_30,(Am_Slot_Key)&local_18,0x195);
    Am_Object::operator=(&local_38,&local_30);
    Am_Object::~Am_Object(&local_30);
    bVar1 = Am_Object::Valid(&local_38);
    if (bVar1) {
      pAVar2 = Am_Object::Get(cmd,0x16c,1);
      Am_Value::operator=(&local_28,pAVar2);
      Am_Object::Set(&local_38,0x16c,&local_28,0);
      pAVar2 = Am_Object::Get(cmd,0x169,1);
      Am_Value::operator=(&local_28,pAVar2);
      Am_Object::Set(&local_38,0x169,&local_28,0);
      pAVar2 = Am_Object::Get(cmd,0x16d,1);
      Am_Value::operator=(&local_28,pAVar2);
      Am_Object::Set(&local_38,0x16d,&local_28,0);
      Am_Object::Set(&local_38,0xda,true,0);
    }
  }
  Am_Value::~Am_Value(&local_28);
  Am_Object::~Am_Object(&local_38);
  Am_Object::~Am_Object(&local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, copy_values_for_grow, (Am_Object cmd))
{
  //copy from me to widget's command
  Am_Object widget, widget_command;
  widget = cmd.Get_Owner().Get_Owner();
  Am_Value value;
  if (widget.Valid()) {
    widget_command = widget.Get_Object(Am_MOVE_GROW_COMMAND);
    if (widget_command.Valid()) {
      value = cmd.Peek(Am_OLD_VALUE);
      widget_command.Set(Am_OLD_VALUE, value);
      value = cmd.Peek(Am_VALUE);
      widget_command.Set(Am_VALUE, value);
      value = cmd.Peek(Am_OBJECT_MODIFIED);
      widget_command.Set(Am_OBJECT_MODIFIED, value);

      widget_command.Set(Am_GROWING, true);
    }
  }
}